

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O1

void Fixpp::
     set<Fixpp::TagT<459u,Fixpp::Type::String>,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>>,char_const(&)[11]>
               (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                *message,char (*value) [11])

{
  bitset<2UL> *pbVar1;
  size_type __len1;
  size_t __len2;
  
  __len1 = (message->
           super_MessageBase<Fixpp::Field,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>
           ).values.base.
           super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>,_false>.
           value.val_._M_string_length;
  __len2 = strlen(*value);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(message->
              super_MessageBase<Fixpp::Field,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>
              ).values.base.
              super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>,_false>,0
             ,__len1,*value,__len2);
  (message->
  super_MessageBase<Fixpp::Field,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>
  ).values.base.super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>,_false>
  .value.empty_ = false;
  pbVar1 = &(message->
            super_MessageBase<Fixpp::Field,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>
            ).allBits;
  *(byte *)&(pbVar1->super__Base_bitset<1UL>)._M_w =
       (byte)(pbVar1->super__Base_bitset<1UL>)._M_w | 2;
  return;
}

Assistant:

decltype(auto)
    set(Message& message, Value&& value)
    {
        using Index = details::TagIndex<typename Message::TagsList, Tag>;
        using RequiredIndex = details::TagIndex<typename Message::RequiredList, Tag>;

        static_assert(Index::Valid, "Invalid tag for given message");
        static_assert(details::IsValidTypeFor<Tag, Value>::value, "Invalid data type for given Tag");

        meta::get<Index::Value>(message.values).set(std::forward<Value>(value));

        message.allBits.set(Index::Value);

        if (identity(RequiredIndex::Valid))
            message.requiredBits.set(static_cast<size_t>(RequiredIndex::Value));
    }